

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  nk_plugin_alloc p_Var1;
  void *src0;
  nk_uint nVar2;
  nk_size nVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  nk_size back_size;
  float fVar9;
  nk_size alignment;
  nk_size local_40;
  nk_size local_38;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcc,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcd,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  b->needed = b->needed + size;
  if (type == NK_BUFFER_FRONT) {
    nVar3 = b->allocated;
  }
  else {
    nVar3 = b->size - size;
  }
  pvVar4 = nk_buffer_align((void *)((long)(b->memory).ptr + nVar3),align,&local_40,type);
  if (type == NK_BUFFER_FRONT) {
    uVar7 = b->allocated;
    if (b->size < uVar7 + size + local_40) goto LAB_00106f1d;
LAB_0010704a:
    b->allocated = size + local_40 + uVar7;
  }
  else {
    uVar7 = b->allocated;
    uVar6 = b->size;
    uVar5 = local_40 + size;
    uVar8 = 0;
    if (uVar5 <= uVar6) {
      uVar8 = uVar6 - uVar5;
    }
    if (uVar8 <= uVar7) {
LAB_00106f1d:
      if (b->type != NK_BUFFER_DYNAMIC) {
        return (void *)0x0;
      }
      p_Var1 = (b->pool).alloc;
      if ((p_Var1 == (nk_plugin_alloc)0x0) || ((b->pool).free == (nk_plugin_free)0x0)) {
        __assert_fail("b->pool.alloc && b->pool.free",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x1fe0,
                      "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                     );
      }
      nVar3 = (b->memory).size;
      fVar9 = (float)nVar3 * b->grow_factor;
      uVar5 = (ulong)fVar9;
      uVar5 = (long)(fVar9 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      local_38 = align;
      nVar2 = nk_round_up_pow2((int)uVar7 + (int)size);
      if (uVar5 <= nVar2) {
        uVar5 = (ulong)nVar2;
      }
      pvVar4 = (*p_Var1)((b->pool).userdata,(b->memory).ptr,uVar5);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x1faa,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
      }
      (b->memory).size = uVar5;
      src0 = (b->memory).ptr;
      if (pvVar4 != src0) {
        nk_memcopy(pvVar4,src0,nVar3);
        (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
      }
      nVar3 = nVar3 - b->size;
      if (nVar3 != 0) {
        uVar5 = uVar5 - nVar3;
        nk_memcopy((void *)((long)pvVar4 + uVar5),(void *)(b->size + (long)pvVar4),nVar3);
      }
      b->size = uVar5;
      (b->memory).ptr = pvVar4;
      if (type == NK_BUFFER_FRONT) {
        nVar3 = b->allocated;
      }
      else {
        nVar3 = uVar5 - size;
      }
      pvVar4 = nk_buffer_align((void *)((long)pvVar4 + nVar3),local_38,&local_40,type);
      if (type == NK_BUFFER_FRONT) {
        uVar7 = b->allocated;
        goto LAB_0010704a;
      }
      uVar6 = b->size;
      uVar5 = size + local_40;
    }
    b->size = uVar6 - uVar5;
  }
  b->needed = local_40 + b->needed;
  b->calls = b->calls + 1;
  return pvVar4;
}

Assistant:

NK_LIB void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - NK_MIN(b->size,(size + alignment))) <= b->allocated);

    if (full) {
        nk_size capacity;
        if (b->type != NK_BUFFER_DYNAMIC)
            return 0;
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }
    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}